

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  code *pcVar1;
  uint newSize;
  bool bVar2;
  uint uVar3;
  hash_t hVar4;
  EntryType *dst;
  undefined4 *puVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  int *local_48;
  int *newBuckets;
  int local_34 [2];
  int modIndex;
  
  newSize = this->count * 2;
  local_34[0] = 0x4b;
  uVar3 = 4;
  if (8 < newSize) {
    uVar3 = this->count & 0x7fffffff;
  }
  uVar3 = PrimePolicy::GetPrime(uVar3,local_34);
  local_48 = (Type)0x0;
  newBuckets = (int *)0x0;
  if (uVar3 == this->bucketCount) {
    dst = AllocateEntries(this,newSize,true);
    Memory::
    CopyArray<JsUtil::DictionaryEntry<Js::InternalString,UnifiedRegex::RegexStats*>,UnifiedRegex::RegexStats*,Memory::ArenaAllocator>
              (dst,(long)(int)newSize,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = dst;
    this->size = newSize;
    this->modFunctionIndex = local_34[0];
  }
  else {
    Allocate(this,&local_48,(EntryType **)&newBuckets,uVar3,newSize);
    Memory::
    CopyArray<JsUtil::DictionaryEntry<Js::InternalString,UnifiedRegex::RegexStats*>,UnifiedRegex::RegexStats*,Memory::ArenaAllocator>
              ((DictionaryEntry<Js::InternalString,_UnifiedRegex::RegexStats_*> *)newBuckets,
               (long)(int)newSize,this->entries,(long)this->count);
    this->modFunctionIndex = local_34[0];
    iVar10 = this->count;
    if (0 < iVar10) {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar11 = 0;
      piVar9 = newBuckets;
      do {
        if (-2 < piVar9[lVar11 * 10 + 2]) {
          if ((ulong)(uint)piVar9[lVar11 * 10 + 4] == 0) {
            uVar6 = 0x2393b8b;
          }
          else {
            uVar6 = 0x811c9dc5;
            uVar7 = 0;
            do {
              uVar8 = *(ushort *)
                       ((ulong)((uint)*(byte *)(piVar9 + lVar11 * 10 + 5) * 2) +
                        *(long *)(piVar9 + lVar11 * 10 + 6) + uVar7 * 2) ^ uVar6;
              uVar6 = uVar8 * 0x1000193;
              uVar7 = uVar7 + 1;
            } while ((uint)piVar9[lVar11 * 10 + 4] != uVar7);
            uVar6 = uVar8 * 0x2000326 + 1;
          }
          if (uVar6 != piVar9[lVar11 * 10 + 8]) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                               ,0xce,
                               "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                               ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar5 = 0;
            uVar6 = piVar9[lVar11 * 10 + 8];
          }
          hVar4 = PrimePolicy::ModPrime(uVar6 >> 1,uVar3,this->modFunctionIndex);
          newBuckets[lVar11 * 10 + 2] = local_48[(int)hVar4];
          local_48[(int)hVar4] = (int)lVar11;
          iVar10 = this->count;
          piVar9 = newBuckets;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < iVar10);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_48;
    this->entries = (Type)newBuckets;
    this->bucketCount = uVar3;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }